

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86::forward_inplace(BinaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  _func_int *p_Var2;
  __m128 afVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  int iVar7;
  __m128 *pafVar8;
  int iVar9;
  undefined1 (*pauVar10) [16];
  float fVar11;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  __m128 afVar22;
  binary_op_pow_pack4 op;
  __m128 _b;
  binary_op_pow_pack4 local_6d;
  int local_6c;
  Mat *local_68;
  long local_60;
  __m128 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (bottom_top_blob->elempack != 4) {
switchD_002415ea_default:
    iVar5 = BinaryOp::forward_inplace
                      ((BinaryOp *)
                       ((long)&this->_vptr_BinaryOp_x86 + (long)this->_vptr_BinaryOp_x86[-3]),
                       bottom_top_blob,opt);
    return iVar5;
  }
  p_Var2 = this->_vptr_BinaryOp_x86[-3];
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
  case 0:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar10 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar9 = iVar7;
          do {
            auVar12._0_4_ = *(float *)*pauVar10 + fVar11;
            auVar12._4_4_ = *(float *)((long)*pauVar10 + 4) + fVar11;
            auVar12._8_4_ = *(float *)((long)*pauVar10 + 8) + fVar11;
            auVar12._12_4_ = *(float *)((long)*pauVar10 + 0xc) + fVar11;
            *pauVar10 = auVar12;
            pauVar10 = pauVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 1:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar10 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar9 = iVar7;
          do {
            auVar15._0_4_ = *(float *)*pauVar10 - fVar11;
            auVar15._4_4_ = *(float *)((long)*pauVar10 + 4) - fVar11;
            auVar15._8_4_ = *(float *)((long)*pauVar10 + 8) - fVar11;
            auVar15._12_4_ = *(float *)((long)*pauVar10 + 0xc) - fVar11;
            *pauVar10 = auVar15;
            pauVar10 = pauVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 2:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar10 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar9 = iVar7;
          do {
            auVar13._0_4_ = *(float *)*pauVar10 * fVar11;
            auVar13._4_4_ = *(float *)((long)*pauVar10 + 4) * fVar11;
            auVar13._8_4_ = *(float *)((long)*pauVar10 + 8) * fVar11;
            auVar13._12_4_ = *(float *)((long)*pauVar10 + 0xc) * fVar11;
            *pauVar10 = auVar13;
            pauVar10 = pauVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 3:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar11 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar10 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar9 = iVar7;
          do {
            auVar14._0_4_ = *(float *)*pauVar10 * fVar11;
            auVar14._4_4_ = *(float *)((long)*pauVar10 + 4) * fVar11;
            auVar14._8_4_ = *(float *)((long)*pauVar10 + 8) * fVar11;
            auVar14._12_4_ = *(float *)((long)*pauVar10 + 0xc) * fVar11;
            *pauVar10 = auVar14;
            pauVar10 = pauVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 4:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar10 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar9 = iVar7;
          do {
            auVar4._4_4_ = uVar1;
            auVar4._0_4_ = uVar1;
            auVar4._8_4_ = uVar1;
            auVar4._12_4_ = uVar1;
            auVar16 = maxps(*pauVar10,auVar4);
            *pauVar10 = auVar16;
            pauVar10 = pauVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 5:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar10 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar9 = iVar7;
          do {
            auVar16._4_4_ = uVar1;
            auVar16._0_4_ = uVar1;
            auVar16._8_4_ = uVar1;
            auVar16._12_4_ = uVar1;
            auVar16 = minps(*pauVar10,auVar16);
            *pauVar10 = auVar16;
            pauVar10 = pauVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 6:
    local_48 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    local_6c = bottom_top_blob->h * bottom_top_blob->w;
    local_60 = (long)bottom_top_blob->c;
    if (0 < local_60) {
      lVar6 = 0;
      local_68 = bottom_top_blob;
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      do {
        if (0 < local_6c) {
          pafVar8 = (__m128 *)(local_68->cstep * lVar6 * local_68->elemsize + (long)local_68->data);
          iVar5 = local_6c;
          do {
            local_58 = *pafVar8;
            afVar22 = binary_op_pow_pack4::operator()(&local_6d,&local_58,(__m128 *)&local_48);
            afVar3[2] = (float)extraout_XMM0_Dc;
            afVar3[0] = (float)(int)afVar22._0_8_;
            afVar3[1] = (float)(int)((ulong)afVar22._0_8_ >> 0x20);
            afVar3[3] = extraout_XMM0_Dd;
            *pafVar8 = afVar3;
            pafVar8 = pafVar8 + 1;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != local_60);
    }
    break;
  case 7:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar10 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar9 = iVar7;
          do {
            auVar16 = *pauVar10;
            auVar17._0_4_ = fVar11 - auVar16._0_4_;
            auVar17._4_4_ = fVar11 - auVar16._4_4_;
            auVar17._8_4_ = fVar11 - auVar16._8_4_;
            auVar17._12_4_ = fVar11 - auVar16._12_4_;
            *pauVar10 = auVar17;
            pauVar10 = pauVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  case 8:
    iVar5 = bottom_top_blob->c;
    if (0 < (long)iVar5) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w;
      fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          pauVar10 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar9 = iVar7;
          do {
            auVar16 = *pauVar10;
            in_XMM2 = rcpps(in_XMM2,auVar16);
            fVar18 = fVar11 * in_XMM2._0_4_;
            fVar19 = fVar11 * in_XMM2._4_4_;
            fVar20 = fVar11 * in_XMM2._8_4_;
            fVar21 = fVar11 * in_XMM2._12_4_;
            *(float *)*pauVar10 = (fVar11 - auVar16._0_4_ * fVar18) * in_XMM2._0_4_ + fVar18;
            *(float *)(*pauVar10 + 4) = (fVar11 - auVar16._4_4_ * fVar19) * in_XMM2._4_4_ + fVar19;
            *(float *)(*pauVar10 + 8) = (fVar11 - auVar16._8_4_ * fVar20) * in_XMM2._8_4_ + fVar20;
            *(float *)(*pauVar10 + 0xc) =
                 (fVar11 - auVar16._12_4_ * fVar21) * in_XMM2._12_4_ + fVar21;
            pauVar10 = pauVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar5);
    }
    break;
  default:
    goto switchD_002415ea_default;
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}